

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  uint uVar1;
  size_t __n;
  int iVar2;
  uchar *puVar3;
  mbedtls_x509_crt *pmVar4;
  mbedtls_x509_crt *pmVar5;
  mbedtls_x509_crt *crt;
  uchar *puVar6;
  mbedtls_x509_crt *pmVar7;
  int iVar8;
  uchar *p;
  size_t len;
  mbedtls_x509_buf sig_params1;
  size_t len_1;
  mbedtls_x509_buf sig_params2;
  uchar *local_b8;
  uchar *local_b0;
  size_t local_a8;
  int *local_a0;
  mbedtls_x509_buf local_98;
  ulong local_78;
  size_t local_70;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf local_48;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar4 = chain;
  pmVar5 = (mbedtls_x509_crt *)0x0;
  do {
    pmVar7 = pmVar5;
    pmVar5 = pmVar4;
    crt = pmVar5;
    if (pmVar5->version == 0) goto LAB_001774b3;
    pmVar4 = pmVar5->next;
  } while (pmVar5->next != (mbedtls_x509_crt *)0x0);
  if ((pmVar5->version != 0) && (pmVar5->next == (mbedtls_x509_crt *)0x0)) {
    pmVar4 = (mbedtls_x509_crt *)calloc(1,0x228);
    pmVar5->next = pmVar4;
    if (pmVar4 == (mbedtls_x509_crt *)0x0) {
      return -0x2880;
    }
    memset(pmVar4,0,0x228);
    crt = pmVar5->next;
    pmVar7 = pmVar5;
  }
LAB_001774b3:
  local_98.tag = 0;
  local_98._4_4_ = 0;
  local_98.len = 0;
  local_98.p = (uchar *)0x0;
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  iVar2 = -0x2800;
  if ((buf == (uchar *)0x0) || (crt == (mbedtls_x509_crt *)0x0)) goto LAB_001775d3;
  local_a8 = buflen;
  puVar3 = (uchar *)calloc(1,buflen);
  local_b8 = puVar3;
  if (puVar3 == (uchar *)0x0) {
    iVar2 = -0x2880;
    goto LAB_001775d3;
  }
  memcpy(puVar3,buf,buflen);
  (crt->raw).p = puVar3;
  (crt->raw).len = buflen;
  puVar3 = puVar3 + buflen;
  iVar2 = mbedtls_asn1_get_tag(&local_b8,puVar3,&local_a8,0x30);
  puVar6 = local_b8;
  if (iVar2 != 0) {
    mbedtls_x509_crt_free(crt);
    iVar2 = -0x2180;
    goto LAB_001775d3;
  }
  if ((ulong)((long)puVar3 - (long)local_b8) < local_a8) goto LAB_001775be;
  local_78 = local_a8;
  (crt->tbs).p = local_b8;
  iVar2 = mbedtls_asn1_get_tag(&local_b8,puVar3,&local_a8,0x30);
  if (iVar2 != 0) {
LAB_00177632:
    mbedtls_x509_crt_free(crt);
    iVar2 = iVar2 + -0x2180;
    goto LAB_001775d3;
  }
  local_b0 = local_b8 + local_a8;
  (crt->tbs).len = (long)local_b0 - (long)(crt->tbs).p;
  local_a0 = &crt->version;
  iVar2 = mbedtls_asn1_get_tag(&local_b8,local_b0,&local_70,0xa0);
  if (iVar2 == 0) {
    puVar3 = local_b8 + local_70;
    iVar2 = mbedtls_asn1_get_int(&local_b8,puVar3,local_a0);
    if (iVar2 == 0) {
      iVar2 = -0x2266;
      if (local_b8 == puVar3) {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = iVar2 + -0x2200;
    }
  }
  else if (iVar2 == -0x62) {
    *local_a0 = 0;
    iVar2 = 0;
  }
  puVar3 = local_b0;
  if ((iVar2 == 0) && (iVar2 = mbedtls_x509_get_serial(&local_b8,local_b0,&crt->serial), iVar2 == 0)
     ) {
    iVar2 = mbedtls_x509_get_alg(&local_b8,puVar3,&crt->sig_oid,&local_98);
    if (iVar2 == 0) {
      uVar1 = *local_a0;
      *local_a0 = uVar1 + 1;
      if (2 < (int)uVar1) {
        mbedtls_x509_crt_free(crt);
        iVar2 = -0x2580;
        goto LAB_001775d3;
      }
      iVar2 = mbedtls_x509_get_sig_alg
                        (&crt->sig_oid,&local_98,&crt->sig_md,&crt->sig_pk,&crt->sig_opts);
      if (iVar2 != 0) {
        mbedtls_x509_crt_free(crt);
        goto LAB_001775d3;
      }
      (crt->issuer_raw).p = local_b8;
      iVar2 = mbedtls_asn1_get_tag(&local_b8,local_b0,&local_a8,0x30);
      if (iVar2 != 0) goto LAB_00177632;
      iVar2 = mbedtls_x509_get_name(&local_b8,local_b8 + local_a8,&crt->issuer);
      if (iVar2 == 0) {
        (crt->issuer_raw).len = (long)local_b8 - (long)(crt->issuer_raw).p;
        iVar2 = x509_get_dates(&local_b8,local_b0,&crt->valid_from,&crt->valid_to);
        if (iVar2 == 0) {
          (crt->subject_raw).p = local_b8;
          iVar2 = mbedtls_asn1_get_tag(&local_b8,local_b0,&local_a8,0x30);
          if (iVar2 != 0) {
            mbedtls_x509_crt_free(crt);
            iVar2 = iVar2 + -0x2180;
            goto LAB_001775d3;
          }
          if ((local_a8 == 0) ||
             (iVar2 = mbedtls_x509_get_name(&local_b8,local_b8 + local_a8,&crt->subject), iVar2 == 0
             )) {
            (crt->subject_raw).len = (long)local_b8 - (long)(crt->subject_raw).p;
            iVar2 = mbedtls_pk_parse_subpubkey(&local_b8,local_b0,&crt->pk);
            if ((((iVar2 == 0) &&
                 (((*local_a0 & 0xfffffffeU) != 2 ||
                  (iVar2 = x509_get_uid(&local_b8,local_b0,&crt->issuer_id,1), iVar2 == 0)))) &&
                (((*local_a0 & 0xfffffffeU) != 2 ||
                 (iVar2 = x509_get_uid(&local_b8,local_b0,&crt->subject_id,2), iVar2 == 0)))) &&
               ((*local_a0 != 3 || (iVar2 = x509_get_crt_ext(&local_b8,local_b0,crt), iVar2 == 0))))
            {
              if (local_b8 != local_b0) {
LAB_001775be:
                mbedtls_x509_crt_free(crt);
                iVar2 = -0x21e6;
                goto LAB_001775d3;
              }
              puVar6 = puVar6 + local_78;
              iVar2 = mbedtls_x509_get_alg(&local_b8,puVar6,&local_68,&local_48);
              if (iVar2 == 0) {
                __n = (crt->sig_oid).len;
                if ((((__n != local_68.len) ||
                     (iVar2 = bcmp((crt->sig_oid).p,local_68.p,__n), iVar2 != 0)) ||
                    (local_98.len != local_48.len)) ||
                   ((local_98.len != 0 &&
                    (iVar2 = bcmp(local_98.p,local_48.p,local_98.len), iVar2 != 0)))) {
                  mbedtls_x509_crt_free(crt);
                  iVar2 = -0x2680;
                  goto LAB_001775d3;
                }
                iVar2 = mbedtls_x509_get_sig(&local_b8,puVar6,&crt->sig);
                if (iVar2 == 0) {
                  if (local_b8 == puVar6) {
                    iVar2 = 0;
                    goto LAB_001775d3;
                  }
                  goto LAB_001775be;
                }
              }
            }
          }
        }
      }
      mbedtls_x509_crt_free(crt);
      goto LAB_001775d3;
    }
  }
  mbedtls_x509_crt_free(crt);
LAB_001775d3:
  iVar8 = 0;
  if (iVar2 != 0) {
    if (pmVar7 != (mbedtls_x509_crt *)0x0) {
      pmVar7->next = (mbedtls_x509_crt *)0x0;
    }
    iVar8 = iVar2;
    if (crt != chain) {
      free(crt);
    }
  }
  return iVar8;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}